

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O3

void __thiscall
cfgfile::input_stream_t<cfgfile::qstring_trait_t>::input_stream_t
          (input_stream_t<cfgfile::qstring_trait_t> *this,string_t *file_name,istream_t *input)

{
  Data *pDVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  
  this->m_stream = input;
  this->m_line_number = 1;
  this->m_column_number = 1;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_prev_positions).c.
  super__Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
  ::_M_initialize_map((_Deque_base<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::qstring_trait_t>::position_t>_>
                       *)&this->m_prev_positions,0);
  pDVar1 = (file_name->m_str).d.d;
  (this->m_file_name).m_str.d.d = pDVar1;
  (this->m_file_name).m_str.d.ptr = (file_name->m_str).d.ptr;
  (this->m_file_name).m_str.d.size = (file_name->m_str).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_returned_char).c.super__Deque_base<QChar,_std::allocator<QChar>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<QChar,_std::allocator<QChar>_>::_M_initialize_map
            ((_Deque_base<QChar,_std::allocator<QChar>_> *)&this->m_returned_char,0);
  this->m_stream_size = 0;
  this->m_stream_pos = 0;
  (this->m_buf).d.size = 0;
  this->m_buf_pos = 0;
  (this->m_buf).d.d = (Data *)0x0;
  (this->m_buf).d.ptr = (char16_t *)0x0;
  QTextStream::read((longlong)&local_48);
  pQVar2 = &((this->m_buf).d.d)->super_QArrayData;
  pcVar3 = (this->m_buf).d.ptr;
  (this->m_buf).d.d = (Data *)local_48;
  (this->m_buf).d.ptr = pcStack_40;
  qVar4 = (this->m_buf).d.size;
  (this->m_buf).d.size = local_38;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      local_48 = pQVar2;
      pcStack_40 = pcVar3;
      local_38 = qVar4;
      QArrayData::deallocate(pQVar2,2,8);
    }
  }
  this->m_stream_pos = this->m_stream_pos + (this->m_buf).d.size;
  return;
}

Assistant:

input_stream_t( const typename Trait::string_t & file_name,
		typename Trait::istream_t & input )
		:	m_stream( input )
		,	m_line_number( 1 )
		,	m_column_number( 1 )
		,	m_file_name( file_name )
		,	m_buf_pos( 0 )
		,	m_stream_pos( 0 )
	{
		Trait::noskipws( m_stream );

		m_stream_size = Trait::size_of_file( m_stream );

		if( m_stream_size < 0 )
			m_stream_size = 0;

		Trait::fill_buf( m_stream, m_buf, c_buff_size, m_stream_pos, m_stream_size );
	}